

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cp.cpp
# Opt level: O2

bool __thiscall CmdCp::CopyFile(CmdCp *this,string *fileFrom,string *fileTo)

{
  bool bVar1;
  char cVar2;
  FileType FVar3;
  ostream *poVar4;
  long *plVar5;
  char buf;
  ofstream fout;
  ifstream fin;
  
  bVar1 = DirUtils::IsSameDir(fileFrom,fileTo);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"cp: \'");
    poVar4 = std::operator<<(poVar4,(string *)fileFrom);
    poVar4 = std::operator<<(poVar4,"\' and \'");
    poVar4 = std::operator<<(poVar4,(string *)fileTo);
    poVar4 = std::operator<<(poVar4,"\' are the same file");
    std::endl<char,std::char_traits<char>>(poVar4);
    cVar2 = '\0';
  }
  else {
    std::ifstream::ifstream(&fin,(fileFrom->_M_dataplus)._M_p,_S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,"cp: cannot stat \'");
      poVar4 = std::operator<<(poVar4,(string *)fileFrom);
      poVar4 = std::operator<<(poVar4,"\': No such file or directory");
      std::endl<char,std::char_traits<char>>(poVar4);
      cVar2 = '\0';
    }
    else {
      FVar3 = DirUtils::GetFileType(fileTo);
      if (FVar3 == DU_DIRECTORY) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                       fileTo,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                       fileFrom);
        std::__cxx11::string::operator=((string *)fileTo,(string *)&fout);
        std::__cxx11::string::~string((string *)&fout);
        std::__cxx11::string::~string((string *)&buf);
      }
      std::ofstream::ofstream(&fout,(fileTo->_M_dataplus)._M_p,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,"cp: cannot regular file \'");
        poVar4 = std::operator<<(poVar4,(string *)fileTo);
        poVar4 = std::operator<<(poVar4,"\': No such file or directory");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        while( true ) {
          plVar5 = (long *)std::istream::read((char *)&fin,(long)&buf);
          if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
          std::ostream::write((char *)&fout,(long)&buf);
        }
        std::ifstream::close();
        std::ofstream::close();
      }
      std::ofstream::~ofstream(&fout);
    }
    std::ifstream::~ifstream(&fin);
  }
  return (bool)cVar2;
}

Assistant:

bool CmdCp::CopyFile(string fileFrom, string fileTo){
	if(IsSameDir(fileFrom, fileTo)){
		cout << "cp: '" << fileFrom << "' and '" << fileTo << "' are the same file" << endl;
		return false;
	}
	/* input file */
	ifstream fin(fileFrom.c_str(), ios::binary);
	if(!fin.is_open()){
		cout << "cp: cannot stat '" << fileFrom << "': No such file or directory" << endl;
		return false;
	}
	/* output file */
	if(GetFileType(fileTo) == DU_DIRECTORY){
		fileTo = fileTo + "/" + fileFrom;
	}
	
	ofstream fout(fileTo.c_str(), ios::binary);
	if(!fout.is_open()){
		cout << "cp: cannot regular file '" << fileTo << "': No such file or directory" << endl;
		return false;
	}
	/* copying */
	char buf;
	while(fin.read(&buf, sizeof(buf))){
		fout.write(&buf, sizeof(buf));
	}
	fin.close();
	fout.close();
	return true;
}